

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QString::fromLatin1(QString *__return_storage_ptr__,QString *this,QByteArrayView ba)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  pair<QTypedArrayData<char16_t>_*,_char16_t_*> local_60;
  QString *local_50;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  if ((char *)ba.m_size != (char *)0x0) {
    if (this == (QString *)0x0) {
      local_60 = (pair<QTypedArrayData<char16_t>_*,_char16_t_*>)(ZEXT816(0x140f40) << 0x40);
      local_50 = (QString *)0x0;
      QArrayDataPointer<char16_t>::operator=(&local_48,(QArrayDataPointer<char16_t> *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
    }
    else {
      local_60 = QTypedArrayData<char16_t>::allocate((qsizetype)this,KeepSize);
      local_50 = this;
      QArrayDataPointer<char16_t>::operator=(&local_48,(QArrayDataPointer<char16_t> *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
      local_48.ptr[(long)this] = L'\0';
      qt_from_latin1(local_48.ptr,(char *)ba.m_size,(size_t)this);
    }
  }
  qVar3 = local_48.size;
  pcVar2 = local_48.ptr;
  pDVar1 = local_48.d;
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = pcVar2;
  local_48.size = 0;
  (__return_storage_ptr__->d).size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::fromLatin1(QByteArrayView ba)
{
    DataPointer d;
    if (!ba.data()) {
        // nothing to do
    } else if (ba.size() == 0) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        d = DataPointer(ba.size(), ba.size());
        Q_CHECK_PTR(d.data());
        d.data()[ba.size()] = '\0';
        char16_t *dst = d.data();

        qt_from_latin1(dst, ba.data(), size_t(ba.size()));
    }
    return QString(std::move(d));
}